

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall
ON_Mesh::GetCurvatureStats(ON_Mesh *this,curvature_style kappa_style,ON_MeshCurvatureStats *stats)

{
  bool bVar1;
  int Kcount;
  ON_MeshCurvatureStats *pOVar2;
  ON_SurfaceCurvature *K;
  ON_3fVector *N;
  ON_Mesh *p;
  int ksi;
  bool rc;
  ON_MeshCurvatureStats *stats_local;
  curvature_style kappa_style_local;
  ON_Mesh *this_local;
  
  p._7_1_ = false;
  ON_MeshCurvatureStats::Destroy(stats);
  switch(kappa_style) {
  case gaussian_curvature:
    p._0_4_ = 0;
    break;
  case mean_curvature:
    p._0_4_ = 1;
    break;
  case min_curvature:
    p._0_4_ = 2;
    break;
  case max_curvature:
    p._0_4_ = 3;
    break;
  default:
    p._0_4_ = -1;
  }
  if (((-1 < (int)p) && ((int)p < 4)) && (bVar1 = HasPrincipalCurvatures(this), bVar1)) {
    if (this->m_kstat[(int)p] == (ON_MeshCurvatureStats *)0x0) {
      pOVar2 = (ON_MeshCurvatureStats *)operator_new(0x40);
      ON_MeshCurvatureStats::ON_MeshCurvatureStats(pOVar2);
      this->m_kstat[(int)p] = pOVar2;
      pOVar2 = this->m_kstat[(int)p];
      Kcount = ON_SimpleArray<ON_SurfaceCurvature>::Count(&this->m_K);
      K = ON_SimpleArray<ON_SurfaceCurvature>::Array(&this->m_K);
      N = ON_SimpleArray<ON_3fVector>::Array(&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
      ON_MeshCurvatureStats::Set(pOVar2,kappa_style,Kcount,K,N,0.0);
    }
    p._7_1_ = this->m_kstat[(int)p] != (ON_MeshCurvatureStats *)0x0;
    if (p._7_1_) {
      ON_MeshCurvatureStats::operator=(stats,this->m_kstat[(int)p]);
    }
  }
  return p._7_1_;
}

Assistant:

bool ON_Mesh::GetCurvatureStats( // returns true if successful
       ON::curvature_style kappa_style,
       ON_MeshCurvatureStats& stats
       ) const
{
  bool rc = false;
  stats.Destroy();
  int ksi;
  switch ( kappa_style ) {
    case ON::gaussian_curvature:
      ksi = 0;
      break;
    case ON::mean_curvature:
      ksi = 1;
      break;
    case ON::min_curvature: // minimum unsigned radius of curvature
      ksi = 2;
      break;
    case ON::max_curvature: // maximum unsigned radius of curvature
      ksi = 3;
      break;
    //case ON::section_curvature_x:
    //  ksi = 4;
    //  break;
    //case ON::section_curvature_y:
    //  ksi = 5;
    //  break;
    //case ON::section_curvature_z:
    //  ksi = 6;
    //  break;
    default:
      ksi = -1;
      break;
  }
  if ( ksi >= 0 && ksi <= 3 && HasPrincipalCurvatures() ) {
    ON_Mesh* p = (ON_Mesh*)this; // const lie 
    if ( !m_kstat[ksi] ) {
      p->m_kstat[ksi] = new ON_MeshCurvatureStats();
      p->m_kstat[ksi]->Set( kappa_style, m_K.Count(), m_K.Array(), m_N.Array() );
    }
    if ( p->m_kstat[ksi] ) {
      stats = *p->m_kstat[ksi];
      rc = true;
    }
  }
  return rc;
}